

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

void __thiscall banksia::ChessBoard::takeBack(ChessBoard *this)

{
  pointer pHVar1;
  pointer pcVar2;
  Hist *__p;
  value_type hist;
  int local_b8;
  int iStack_b4;
  PieceType PStack_b0;
  PieceType PStack_ac;
  Side local_a8;
  PieceType PStack_a4;
  Side SStack_a0;
  int iStack_9c;
  int local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  int64_t local_40;
  undefined8 uStack_38;
  double local_30;
  
  pHVar1 = (this->super_BoardCore).histList.
           super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_88 = pHVar1[-1].quietCnt;
  local_b8 = pHVar1[-1].move.super_Move.from;
  iStack_b4 = pHVar1[-1].move.super_Move.dest;
  PStack_b0 = pHVar1[-1].move.super_Move.promotion;
  PStack_ac = pHVar1[-1].move.piece.type;
  local_a8 = pHVar1[-1].move.piece.side;
  PStack_a4 = pHVar1[-1].cap.type;
  SStack_a0 = pHVar1[-1].cap.side;
  iStack_9c = pHVar1[-1].enpassant;
  local_98 = pHVar1[-1].status;
  uStack_94._0_1_ = pHVar1[-1].castleRights[0];
  uStack_94._1_1_ = pHVar1[-1].castleRights[1];
  uStack_94._2_2_ = *(undefined2 *)&pHVar1[-1].field_0x26;
  uStack_90 = (undefined4)pHVar1[-1].hashKey;
  uStack_8c = *(undefined4 *)((long)&pHVar1[-1].hashKey + 4);
  pcVar2 = pHVar1[-1].moveString._M_dataplus._M_p;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar2,pcVar2 + pHVar1[-1].moveString._M_string_length);
  pcVar2 = pHVar1[-1].comment._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + pHVar1[-1].comment._M_string_length);
  local_30 = pHVar1[-1].elapsed;
  local_40 = pHVar1[-1].nodes;
  uStack_38._0_4_ = pHVar1[-1].score;
  uStack_38._4_4_ = pHVar1[-1].depth;
  __p = (this->super_BoardCore).histList.
        super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
        super__Vector_impl_data._M_finish + -1;
  (this->super_BoardCore).histList.super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>
  ._M_impl.super__Vector_impl_data._M_finish = __p;
  __gnu_cxx::new_allocator<banksia::Hist>::destroy<banksia::Hist>
            ((new_allocator<banksia::Hist> *)&(this->super_BoardCore).histList,__p);
  (this->super_BoardCore).side = (uint)((this->super_BoardCore).side != white);
  (*(this->super_BoardCore).super_Obj._vptr_Obj[0x16])(this,&local_b8);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  return;
}

Assistant:

void ChessBoard::takeBack() {
    auto hist = histList.back();
    histList.pop_back();
    side = getXSide(side);
    takeBack(hist);
    //    hashKey = hist.hashKey;
    assert(hashKey == initHashKey());
}